

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

ImPlotLimits * ImPlot::GetPlotLimits(ImPlotLimits *__return_storage_ptr__,ImPlotYAxis y_axis_in)

{
  ImPlotRange *pIVar1;
  ImPlotPlot *pIVar2;
  double dVar3;
  
  if (3 < y_axis_in + 1U) {
    __assert_fail("(y_axis_in >= -1 && y_axis_in < 3) && \"y_axis needs to between -1 and IMPLOT_Y_AXES\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xa95,"ImPlotLimits ImPlot::GetPlotLimits(ImPlotYAxis)");
  }
  pIVar2 = GImPlot->CurrentPlot;
  if (pIVar2 != (ImPlotPlot *)0x0) {
    if (y_axis_in < 0) {
      y_axis_in = pIVar2->CurrentYAxis;
    }
    dVar3 = (pIVar2->XAxis).Range.Max;
    (__return_storage_ptr__->X).Min = (pIVar2->XAxis).Range.Min;
    (__return_storage_ptr__->X).Max = dVar3;
    pIVar1 = &pIVar2->YAxis[y_axis_in].Range;
    dVar3 = pIVar1->Max;
    (__return_storage_ptr__->Y).Min = pIVar1->Min;
    (__return_storage_ptr__->Y).Max = dVar3;
    return __return_storage_ptr__;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"GetPlotLimits() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xa96,"ImPlotLimits ImPlot::GetPlotLimits(ImPlotYAxis)");
}

Assistant:

ImPlotLimits GetPlotLimits(ImPlotYAxis y_axis_in) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(y_axis_in >= -1 && y_axis_in < IMPLOT_Y_AXES, "y_axis needs to between -1 and IMPLOT_Y_AXES");
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "GetPlotLimits() needs to be called between BeginPlot() and EndPlot()!");
    const ImPlotYAxis y_axis = y_axis_in >= 0 ? y_axis_in : gp.CurrentPlot->CurrentYAxis;

    ImPlotPlot& plot = *gp.CurrentPlot;
    ImPlotLimits limits;
    limits.X = plot.XAxis.Range;
    limits.Y = plot.YAxis[y_axis].Range;
    return limits;
}